

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

void __thiscall
TwoStageDynamicBayesianNetwork::~TwoStageDynamicBayesianNetwork
          (TwoStageDynamicBayesianNetwork *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  pointer puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  pointer puVar4;
  pointer ppCVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  pointer ppuVar10;
  pointer ppvVar11;
  
  ppCVar5 = (this->_m_Y_CPDs).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->_m_Y_CPDs).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5;
  if (lVar6 != 0) {
    uVar7 = lVar6 >> 3;
    uVar8 = 1;
    uVar9 = 0;
    do {
      if (uVar7 <= uVar9) goto LAB_004893e3;
      if (ppCVar5[uVar9] != (CPDDiscreteInterface *)0x0) {
        (*ppCVar5[uVar9]->_vptr_CPDDiscreteInterface[1])();
      }
      uVar9 = (ulong)uVar8;
      ppCVar5 = (this->_m_Y_CPDs).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(this->_m_Y_CPDs).
                    super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar9);
  }
  ppCVar5 = (this->_m_O_CPDs).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->_m_O_CPDs).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5;
  if (lVar6 != 0) {
    uVar7 = lVar6 >> 3;
    uVar8 = 1;
    uVar9 = 0;
    do {
      if (uVar7 <= uVar9) {
LAB_004893e3:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if (ppCVar5[uVar9] != (CPDDiscreteInterface *)0x0) {
        (*ppCVar5[uVar9]->_vptr_CPDDiscreteInterface[1])();
      }
      uVar9 = (ulong)uVar8;
      ppCVar5 = (this->_m_O_CPDs).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(this->_m_O_CPDs).
                    super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar9);
  }
  for (ppvVar11 = (this->_m_X_restr_perY).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppvVar11 !=
      (this->_m_X_restr_perY).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar11 = ppvVar11 + 1) {
    pvVar1 = *ppvVar11;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pvVar1->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      operator_delete(pvVar1,0x18);
    }
  }
  for (ppvVar11 = (this->_m_A_restr_perY).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppvVar11 !=
      (this->_m_A_restr_perY).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar11 = ppvVar11 + 1) {
    pvVar1 = *ppvVar11;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pvVar1->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      operator_delete(pvVar1,0x18);
    }
  }
  for (ppvVar11 = (this->_m_Y_restr_perY).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppvVar11 !=
      (this->_m_Y_restr_perY).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar11 = ppvVar11 + 1) {
    pvVar1 = *ppvVar11;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pvVar1->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      operator_delete(pvVar1,0x18);
    }
  }
  for (ppvVar11 = (this->_m_X_restr_perO).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppvVar11 !=
      (this->_m_X_restr_perO).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar11 = ppvVar11 + 1) {
    pvVar1 = *ppvVar11;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pvVar1->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      operator_delete(pvVar1,0x18);
    }
  }
  for (ppvVar11 = (this->_m_A_restr_perO).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppvVar11 !=
      (this->_m_A_restr_perO).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar11 = ppvVar11 + 1) {
    pvVar1 = *ppvVar11;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pvVar1->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      operator_delete(pvVar1,0x18);
    }
  }
  for (ppvVar11 = (this->_m_Y_restr_perO).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppvVar11 !=
      (this->_m_Y_restr_perO).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar11 = ppvVar11 + 1) {
    pvVar1 = *ppvVar11;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pvVar1->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      operator_delete(pvVar1,0x18);
    }
  }
  for (ppvVar11 = (this->_m_O_restr_perO).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppvVar11 !=
      (this->_m_O_restr_perO).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar11 = ppvVar11 + 1) {
    pvVar1 = *ppvVar11;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pvVar1->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      operator_delete(pvVar1,0x18);
    }
  }
  for (ppuVar10 = (this->_m_nrVals_SoI_Y_stepsize).
                  super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppuVar10 !=
      (this->_m_nrVals_SoI_Y_stepsize).
      super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppuVar10 = ppuVar10 + 1) {
    if (*ppuVar10 != (unsigned_long *)0x0) {
      operator_delete__(*ppuVar10);
    }
  }
  for (ppuVar10 = (this->_m_nrVals_SoI_O_stepsize).
                  super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppuVar10 !=
      (this->_m_nrVals_SoI_O_stepsize).
      super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppuVar10 = ppuVar10 + 1) {
    if (*ppuVar10 != (unsigned_long *)0x0) {
      operator_delete__(*ppuVar10);
    }
  }
  pvVar1 = this->_m_IndividualToJointYiiIndices_catVector;
  if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pvVar1->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
    operator_delete(pvVar1,0x18);
  }
  pvVar1 = this->_m_IndividualToJointOiiIndices_catVector;
  if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pvVar1->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
    operator_delete(pvVar1,0x18);
  }
  pvVar1 = this->_m_SampleY;
  if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pvVar1->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
    operator_delete(pvVar1,0x18);
  }
  pvVar1 = this->_m_SampleO;
  if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pvVar1->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
    operator_delete(pvVar1,0x18);
  }
  pvVar3 = this->_m_SampleNrO;
  if (pvVar3 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    puVar4 = (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4,(long)(pvVar3->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)puVar4);
    }
    operator_delete(pvVar3,0x18);
  }
  ppvVar11 = (this->_m_O_restr_perO).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar11 != (pointer)0x0) {
    operator_delete(ppvVar11,(long)(this->_m_O_restr_perO).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppvVar11);
  }
  ppvVar11 = (this->_m_Y_restr_perO).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar11 != (pointer)0x0) {
    operator_delete(ppvVar11,(long)(this->_m_Y_restr_perO).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppvVar11);
  }
  ppvVar11 = (this->_m_A_restr_perO).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar11 != (pointer)0x0) {
    operator_delete(ppvVar11,(long)(this->_m_A_restr_perO).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppvVar11);
  }
  ppvVar11 = (this->_m_X_restr_perO).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar11 != (pointer)0x0) {
    operator_delete(ppvVar11,(long)(this->_m_X_restr_perO).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppvVar11);
  }
  ppvVar11 = (this->_m_Y_restr_perY).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar11 != (pointer)0x0) {
    operator_delete(ppvVar11,(long)(this->_m_Y_restr_perY).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppvVar11);
  }
  ppvVar11 = (this->_m_A_restr_perY).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar11 != (pointer)0x0) {
    operator_delete(ppvVar11,(long)(this->_m_A_restr_perY).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppvVar11);
  }
  ppvVar11 = (this->_m_X_restr_perY).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar11 != (pointer)0x0) {
    operator_delete(ppvVar11,(long)(this->_m_X_restr_perY).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppvVar11);
  }
  ppuVar10 = (this->_m_nrVals_SoI_O_stepsize).
             super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppuVar10 != (pointer)0x0) {
    operator_delete(ppuVar10,(long)(this->_m_nrVals_SoI_O_stepsize).
                                   super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppuVar10);
  }
  ppuVar10 = (this->_m_nrVals_SoI_Y_stepsize).
             super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppuVar10 != (pointer)0x0) {
    operator_delete(ppuVar10,(long)(this->_m_nrVals_SoI_Y_stepsize).
                                   super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppuVar10);
  }
  ppCVar5 = (this->_m_O_CPDs).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar5 != (pointer)0x0) {
    operator_delete(ppCVar5,(long)(this->_m_O_CPDs).
                                  super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar5
                   );
  }
  ppCVar5 = (this->_m_Y_CPDs).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar5 != (pointer)0x0) {
    operator_delete(ppCVar5,(long)(this->_m_Y_CPDs).
                                  super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar5
                   );
  }
  puVar4 = (this->_m_ii_size_O).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_ii_size_O).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->_m_Oii_size_O).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_Oii_size_O).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->_m_Yii_size_O).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_Yii_size_O).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->_m_Aii_size_O).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_Aii_size_O).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->_m_Xii_size_O).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_Xii_size_O).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_SoI_O);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_OSoI_O);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_YSoI_O);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_ASoI_O);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_XSoI_O);
  puVar4 = (this->_m_ii_size_Y).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_ii_size_Y).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->_m_Yii_size_Y).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_Yii_size_Y).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->_m_Aii_size_Y).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_Aii_size_Y).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->_m_Xii_size_Y).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_Xii_size_Y).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_SoI_Y);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_YSoI_Y);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_ASoI_Y);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_XSoI_Y);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_OSoI_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_YSoI_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_ASoI_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_XSoI_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_YSoI_Y);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_ASoI_Y);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_XSoI_Y);
  return;
}

Assistant:

TwoStageDynamicBayesianNetwork::~TwoStageDynamicBayesianNetwork()
{
    for(Index i=0;i!=_m_Y_CPDs.size();++i)
        delete _m_Y_CPDs.at(i);
    for(Index i=0;i!=_m_O_CPDs.size();++i)
        delete _m_O_CPDs.at(i);

    // delete by iterator, as temporary data may not be allocated when
    // reading from disk
    { std::vector<std::vector<Index>* >::iterator it;
        for (it=_m_X_restr_perY.begin();it!=_m_X_restr_perY.end();it++)
            delete *it;
        for (it=_m_A_restr_perY.begin();it!=_m_A_restr_perY.end();it++)
            delete *it;
        for (it=_m_Y_restr_perY.begin();it!=_m_Y_restr_perY.end();it++)
            delete *it;

        for (it=_m_X_restr_perO.begin();it!=_m_X_restr_perO.end();it++)
            delete *it;
        for (it=_m_A_restr_perO.begin();it!=_m_A_restr_perO.end();it++)
            delete *it;
        for (it=_m_Y_restr_perO.begin();it!=_m_Y_restr_perO.end();it++)
            delete *it;
        for (it=_m_O_restr_perO.begin();it!=_m_O_restr_perO.end();it++)
            delete *it;
    }
    { std::vector<size_t*>::iterator it;
        for (it=_m_nrVals_SoI_Y_stepsize.begin();it!=_m_nrVals_SoI_Y_stepsize.end();it++)
            delete [] *it;
        for (it=_m_nrVals_SoI_O_stepsize.begin();it!=_m_nrVals_SoI_O_stepsize.end();it++)
            delete [] *it;
    }

    delete _m_IndividualToJointYiiIndices_catVector;
    delete _m_IndividualToJointOiiIndices_catVector;
    delete _m_SampleY;
    delete _m_SampleO;
    delete _m_SampleNrO;
}